

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O0

int __thiscall KParser::_adv_expr(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  BlockInfo local_60;
  BlockInfo *local_20;
  BlockInfo *bi_local;
  KParser *pKStack_10;
  int begin_local;
  KParser *this_local;
  
  local_20 = bi;
  bi_local._4_4_ = begin;
  pKStack_10 = this;
  BlockInfo::BlockInfo(&local_60,bi);
  iVar1 = _or_expr(this,begin,&local_60);
  BlockInfo::~BlockInfo(&local_60);
  return iVar1;
}

Assistant:

int KParser::_adv_expr(int begin,  BlockInfo bi) {
    return _or_expr(begin, bi);
}